

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O3

Vector3d *
opengv::generateRandomTranslation(Vector3d *__return_storage_ptr__,double maximumParallax)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  ActualDstType actualDst;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  uVar2 = rand();
  iVar3 = rand();
  auVar5 = vpinsrd_avx(ZEXT416(uVar2),iVar3,1);
  auVar5 = vcvtdq2pd_avx(auVar5);
  auVar4._8_8_ = 0x41dfffffffc00000;
  auVar4._0_8_ = 0x41dfffffffc00000;
  auVar4 = vdivpd_avx512vl(auVar5,auVar4);
  auVar5._8_8_ = 0xbfe0000000000000;
  auVar5._0_8_ = 0xbfe0000000000000;
  auVar5 = vaddpd_avx512vl(auVar4,auVar5);
  iVar3 = rand();
  dVar1 = (double)iVar3 / 2147483647.0 + -0.5;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = maximumParallax * (auVar5._0_8_ + auVar5._0_8_);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = maximumParallax * (auVar5._8_8_ + auVar5._8_8_);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = (dVar1 + dVar1) * maximumParallax;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d
opengv::generateRandomTranslation( double maximumParallax )
{
  Eigen::Vector3d translation;
  translation[0] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  translation[1] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  translation[2] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  return maximumParallax * translation;
}